

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O0

void __thiscall
dtc::text_input_buffer::source_location::source_location
          (source_location *this,text_input_buffer *buf)

{
  bool bVar1;
  reference pvVar2;
  element_type *peVar3;
  int local_34;
  text_input_buffer *buf_local;
  source_location *this_local;
  
  this->buffer = buf;
  bVar1 = std::
          stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
          ::empty(&buf->input_stack);
  if (bVar1) {
    std::shared_ptr<dtc::input_buffer>::shared_ptr(&this->b,(nullptr_t)0x0);
  }
  else {
    pvVar2 = std::
             stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
             ::top(&buf->input_stack);
    std::shared_ptr<dtc::input_buffer>::shared_ptr(&this->b,pvVar2);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->b);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->b);
    local_34 = peVar3->cursor;
  }
  else {
    local_34 = 0;
  }
  this->cursor = local_34;
  return;
}

Assistant:

source_location(text_input_buffer &buf)
			: buffer(buf),
			  b(buf.input_stack.empty() ? nullptr : buf.input_stack.top()),
			  cursor(b ? b->cursor : 0) {}